

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O0

Vec_Ptr_t * Gia_ManDeriveDivs(Vec_Wrd_t *vSims,int nWords)

{
  int iVar1;
  Vec_Ptr_t *p;
  word *Entry;
  Vec_Ptr_t *vDivs;
  undefined4 local_18;
  int nDivs;
  int i;
  int nWords_local;
  Vec_Wrd_t *vSims_local;
  
  iVar1 = Vec_WrdSize(vSims);
  p = Vec_PtrAlloc(iVar1 / nWords);
  for (local_18 = 0; local_18 < iVar1 / nWords; local_18 = local_18 + 1) {
    Entry = Vec_WrdEntryP(vSims,nWords * local_18);
    Vec_PtrPush(p,Entry);
  }
  return p;
}

Assistant:

Vec_Ptr_t * Gia_ManDeriveDivs( Vec_Wrd_t * vSims, int nWords )
{
    int i, nDivs = Vec_WrdSize(vSims)/nWords;
    Vec_Ptr_t * vDivs = Vec_PtrAlloc( nDivs );
    for ( i = 0; i < nDivs; i++ )
        Vec_PtrPush( vDivs, Vec_WrdEntryP(vSims, nWords*i) );
    return vDivs;
}